

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

int yyparse(void)

{
  size_t __n;
  byte *pbVar1;
  char cVar2;
  RC RVar3;
  byte *__dest;
  NODE *pNVar4;
  ostream *poVar5;
  int iVar6;
  long lVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong *puVar11;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  char *attrname;
  AttrType type;
  NODE *relattr;
  ulong *puVar15;
  uint uVar16;
  long lVar17;
  yy_state_t *yyss1;
  byte *__src;
  bool bVar18;
  yy_state_t yyssa [200];
  YYSTYPE yyvsa [200];
  long local_da8;
  int local_d9c;
  ulong *local_d90;
  byte local_d88 [208];
  ulong local_cb8 [401];
  
  yychar = -2;
  local_da8 = 200;
  pbVar9 = local_d88;
  local_d90 = local_cb8;
  local_d9c = 0;
  uVar12 = 0;
  puVar15 = local_d90;
  __src = pbVar9;
  do {
    *pbVar9 = (byte)uVar12;
    if (__src + local_da8 + -1 <= pbVar9) {
      if (local_da8 < 10000) {
        local_da8 = local_da8 * 2;
        if (9999 < local_da8) {
          local_da8 = 10000;
        }
        __dest = (byte *)malloc(local_da8 * 0x11 + 0xf);
        if (__dest != (byte *)0x0) {
          __n = ((long)pbVar9 - (long)__src) + 1;
          memcpy(__dest,__src,__n);
          uVar10 = local_da8 + 0x1e;
          if (-1 < (long)(local_da8 + 0xfU)) {
            uVar10 = local_da8 + 0xfU;
          }
          puVar11 = (ulong *)(__dest + (uVar10 & 0xfffffffffffffff0));
          memcpy(puVar11,local_d90,__n * 0x10);
          if (__src != local_d88) {
            free(__src);
          }
          if ((long)__n < local_da8) {
            pbVar9 = __dest + ((long)pbVar9 - (long)__src);
            puVar15 = puVar11 + __n * 2 + -2;
            __src = __dest;
            local_d90 = puVar11;
            goto LAB_00117bd3;
          }
          iVar6 = 1;
          goto LAB_0011820f;
        }
      }
      puts("memory exhausted");
      iVar6 = 2;
      __dest = __src;
      goto LAB_00118202;
    }
LAB_00117bd3:
    iVar6 = 0;
    __dest = __src;
    if (uVar12 == 0x41) goto LAB_00118202;
    cVar2 = yypact[(int)uVar12];
    if (cVar2 != -0x6a) {
      if (yychar == -2) {
        yychar = yylex();
      }
      if (0 < yychar) {
        if (yychar != 0x100) {
          iVar6 = 2;
          if ((uint)yychar < 0x129) {
            iVar6 = (int)""[(uint)yychar];
          }
          goto LAB_00117c58;
        }
        yychar = 0x101;
        goto LAB_00117d83;
      }
      yychar = 0;
      iVar6 = 0;
LAB_00117c58:
      uVar16 = cVar2 + iVar6;
      if ((0x71 < uVar16) || (iVar6 != yycheck[uVar16])) goto LAB_00117cc0;
      uVar12 = (uint)yytable[uVar16];
      if (yytable[uVar16] < 1) {
        iVar13 = -uVar12;
        goto LAB_00117cd0;
      }
      bVar18 = local_d9c == 0;
      local_d9c = local_d9c + -1;
      if (bVar18) {
        local_d9c = 0;
      }
      *(YYSTYPE *)(puVar15 + 2) = yylval;
      puVar11 = puVar15 + 2;
      yychar = -2;
      goto LAB_001181d1;
    }
LAB_00117cc0:
    iVar13 = (int)""[(int)uVar12];
    if (""[(int)uVar12] == '\0') {
      if (local_d9c == 3) {
        if (yychar < 1) {
          if (yychar == 0) {
LAB_001181fd:
            iVar6 = 1;
LAB_00118202:
            if (__dest != local_d88) {
LAB_0011820f:
              free(__dest);
            }
            return iVar6;
          }
        }
        else {
          yychar = -2;
        }
      }
      else if (local_d9c == 0) {
        yynerrs = yynerrs + 1;
        puts("syntax error");
      }
LAB_00117d83:
      pbVar8 = pbVar9;
      if (uVar12 != 0) {
        do {
          if (pbVar8 == __src) goto LAB_001181fd;
          puVar15 = puVar15 + -2;
          pbVar9 = pbVar8 + -1;
          pbVar1 = pbVar8 + -1;
          pbVar8 = pbVar9;
        } while (*pbVar1 != 0);
      }
      *(YYSTYPE *)(puVar15 + 2) = yylval;
      puVar11 = puVar15 + 2;
      uVar12 = 1;
      local_d9c = 3;
      goto LAB_001181d1;
    }
LAB_00117cd0:
    iVar6 = 0;
    lVar17 = (long)""[iVar13];
    pNVar4 = (NODE *)puVar15[(1 - lVar17) * 2];
    uVar10 = puVar15[(1 - lVar17) * 2 + 1];
    puVar11 = puVar15;
    switch(iVar13) {
    case 2:
      parse_tree = (NODE *)puVar15[-2];
      goto LAB_00118202;
    case 3:
      iVar6 = isatty(0);
      if (iVar6 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,(char *)*puVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::ostream::flush();
      }
      system((char *)*puVar15);
      goto LAB_00118291;
    case 4:
      reset_scanner();
LAB_00118291:
      iVar6 = 0;
      parse_tree = (NODE *)0x0;
      goto LAB_00118202;
    case 5:
      parse_tree = (NODE *)0x0;
      bExit = 1;
      goto LAB_00118202;
    case 9:
    case 0x3b:
    case 0x48:
      goto switchD_00117d10_caseD_9;
    case 0x1a:
      bQueryPlans = 1;
      pcVar14 = "Query plan display turned on.\n";
      lVar7 = 0x1e;
      goto LAB_00117f80;
    case 0x1b:
      bQueryPlans = 0;
      pcVar14 = "Query plan display turned off.\n";
      lVar7 = 0x1f;
LAB_00117f80:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,lVar7);
      goto switchD_00117d10_caseD_9;
    case 0x1c:
      RVar3 = PF_Manager::ClearBuffer(pPfm);
      if (RVar3 == 0) {
        pcVar14 = "Everything kicked out of Buffer!\n";
        lVar7 = 0x21;
      }
      else {
        pcVar14 = "Trouble clearing buffer!  Things may be pinned.\n";
        lVar7 = 0x30;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,lVar7);
      pNVar4 = (NODE *)0x0;
      goto LAB_0011816b;
    case 0x1d:
      PF_Manager::PrintBuffer(pPfm);
      goto switchD_00117d10_caseD_9;
    case 0x1e:
      PF_Manager::ResizeBuffer(pPfm,(int)*puVar15);
      goto switchD_00117d10_caseD_9;
    case 0x1f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Statistics\n",0xb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"----------\n",0xb);
      StatisticsMgr::Print(pStatisticsMgr);
      goto switchD_00117d10_caseD_9;
    case 0x20:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Statistics reset.\n",0x12);
      StatisticsMgr::Reset(pStatisticsMgr);
      goto switchD_00117d10_caseD_9;
    case 0x21:
      pNVar4 = create_table_node((char *)puVar15[-6],(NODE *)puVar15[-2]);
      break;
    case 0x22:
      pNVar4 = create_index_node((char *)puVar15[-6],(char *)puVar15[-2]);
      break;
    case 0x23:
      pNVar4 = drop_table_node((char *)*puVar15);
      break;
    case 0x24:
      pNVar4 = drop_index_node((char *)puVar15[-6],(char *)puVar15[-2]);
      break;
    case 0x25:
      pNVar4 = load_node((char *)puVar15[-6],(char *)puVar15[-2]);
      break;
    case 0x26:
      pNVar4 = set_node((char *)puVar15[-4],(char *)*puVar15);
      break;
    case 0x27:
      pNVar4 = help_node((char *)*puVar15);
      break;
    case 0x28:
      pNVar4 = print_node((char *)*puVar15);
      break;
    case 0x29:
      bExit = 1;
switchD_00117d10_caseD_9:
      pNVar4 = (NODE *)0x0;
      break;
    case 0x2a:
      pNVar4 = query_node((NODE *)puVar15[-6],(NODE *)puVar15[-2],(NODE *)*puVar15);
      break;
    case 0x2b:
      pNVar4 = insert_node((char *)puVar15[-8],(NODE *)puVar15[-2]);
      break;
    case 0x2c:
      pNVar4 = delete_node((char *)puVar15[-2],(NODE *)*puVar15);
      break;
    case 0x2d:
      pNVar4 = update_node((char *)puVar15[-10],(NODE *)puVar15[-6],(NODE *)puVar15[-2],
                           (NODE *)*puVar15);
      break;
    case 0x2e:
    case 0x33:
    case 0x37:
    case 0x3c:
    case 0x41:
      pNVar4 = prepend((NODE *)puVar15[-4],(NODE *)*puVar15);
      break;
    case 0x2f:
    case 0x34:
    case 0x38:
    case 0x3d:
    case 0x42:
      pNVar4 = (NODE *)*puVar15;
      goto LAB_00117d73;
    case 0x30:
      pNVar4 = attrtype_node((char *)puVar15[-2],(char *)*puVar15);
      break;
    case 0x32:
      pNVar4 = relattr_node((char *)0x0,"*");
LAB_00117d73:
      pNVar4 = list_node(pNVar4);
      break;
    case 0x35:
      pcVar14 = (char *)puVar15[-4];
      attrname = (char *)*puVar15;
      goto LAB_001180b8;
    case 0x36:
      attrname = (char *)*puVar15;
      pcVar14 = (char *)0x0;
LAB_001180b8:
      pNVar4 = relattr_node(pcVar14,attrname);
      break;
    case 0x39:
      pNVar4 = relation_node((char *)*puVar15);
      break;
    case 0x3a:
    case 0x47:
      pNVar4 = (NODE *)*puVar15;
      break;
    case 0x3e:
      pNVar4 = condition_node((NODE *)puVar15[-4],*(CompOp *)(puVar15 + -2),(NODE *)*puVar15);
      break;
    case 0x3f:
      relattr = (NODE *)*puVar15;
      pNVar4 = (NODE *)0x0;
      goto LAB_0011815f;
    case 0x40:
      pNVar4 = (NODE *)*puVar15;
      relattr = (NODE *)0x0;
LAB_0011815f:
      pNVar4 = relattr_or_value_node(relattr,pNVar4);
      break;
    case 0x43:
      type = STRING;
      puVar11 = (ulong *)*puVar15;
      goto LAB_00118103;
    case 0x44:
      type = INT;
      goto LAB_00118103;
    case 0x45:
      type = FLOAT;
      goto LAB_00118103;
    case 0x46:
      type = MBR;
LAB_00118103:
      pNVar4 = value_node(type,puVar11);
      break;
    case 0x49:
      pNVar4 = (NODE *)((ulong)pNVar4 & 0xffffffff00000000 | 3);
      break;
    case 0x4a:
      pNVar4 = (NODE *)((ulong)pNVar4 & 0xffffffff00000000 | 5);
      break;
    case 0x4b:
      pNVar4 = (NODE *)((ulong)pNVar4 & 0xffffffff00000000 | 4);
      break;
    case 0x4c:
      pNVar4 = (NODE *)((ulong)pNVar4 & 0xffffffff00000000 | 6);
      break;
    case 0x4d:
      pNVar4 = (NODE *)(((ulong)pNVar4 & 0xffffffff00000000) + 1);
      break;
    case 0x4e:
      pNVar4 = (NODE *)((ulong)pNVar4 & 0xffffffff00000000 | 2);
    }
LAB_0011816b:
    pbVar9 = pbVar9 + -lVar17;
    puVar11 = puVar15 + lVar17 * -2 + 2;
    puVar15[lVar17 * -2 + 2] = (ulong)pNVar4;
    puVar15[lVar17 * -2 + 3] = uVar10;
    uVar12 = (int)""[(long)""[iVar13] + 0x20] + (uint)*pbVar9;
    if ((uVar12 < 0x72) && ((int)yycheck[uVar12] == (uint)*pbVar9)) {
      uVar12 = (uint)yytable[uVar12];
    }
    else {
      uVar12 = (uint)(byte)yypgoto[""[iVar13]];
    }
LAB_001181d1:
    pbVar9 = pbVar9 + 1;
    puVar15 = puVar11;
  } while( true );
}

Assistant:

int
yyparse (void)
{
    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;



#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = YYEMPTY; /* Cause a token to be read.  */

  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    YYNOMEM;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        YYNOMEM;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          YYNOMEM;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */


  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == YYEMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex ();
    }

  if (yychar <= YYEOF)
    {
      yychar = YYEOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == YYerror)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = YYUNDEF;
      yytoken = YYSYMBOL_YYerror;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    goto yydefault;
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  /* Discard the shifted token.  */
  yychar = YYEMPTY;
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];


  YY_REDUCE_PRINT (yyn);
  switch (yyn)
    {
  case 2: /* start: command ';'  */
#line 167 "src/parse.y"
   {
      parse_tree = (yyvsp[-1].n);
      YYACCEPT;
   }
#line 1308 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 3: /* start: T_SHELL_CMD  */
#line 172 "src/parse.y"
   {
      if (!isatty(0)) {
        cout << ((yyvsp[0].sval)) << "\n";
        cout.flush();
      }
      system((yyvsp[0].sval));
      parse_tree = NULL;
      YYACCEPT;
   }
#line 1322 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 4: /* start: error  */
#line 182 "src/parse.y"
   {
      reset_scanner();
      parse_tree = NULL;
      YYACCEPT;
   }
#line 1332 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 5: /* start: T_EOF  */
#line 188 "src/parse.y"
   {
      parse_tree = NULL;
      bExit = 1;
      YYACCEPT;
   }
#line 1342 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 9: /* command: nothing  */
#line 200 "src/parse.y"
   {
      (yyval.n) = NULL;
   }
#line 1350 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 26: /* queryplans: RW_QUERY_PLAN RW_ON  */
#line 232 "src/parse.y"
   {
      bQueryPlans = 1;
      cout << "Query plan display turned on.\n";
      (yyval.n) = NULL;
   }
#line 1360 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 27: /* queryplans: RW_QUERY_PLAN RW_OFF  */
#line 238 "src/parse.y"
   { 
      bQueryPlans = 0;
      cout << "Query plan display turned off.\n";
      (yyval.n) = NULL;
   }
#line 1370 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 28: /* buffer: RW_RESET RW_BUFFER  */
#line 249 "src/parse.y"
   {
      if (pPfm->ClearBuffer())
         cout << "Trouble clearing buffer!  Things may be pinned.\n";
      else 
         cout << "Everything kicked out of Buffer!\n";
      (yyval.n) = NULL;
   }
#line 1382 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 29: /* buffer: RW_PRINT RW_BUFFER  */
#line 257 "src/parse.y"
   {
      pPfm->PrintBuffer();
      (yyval.n) = NULL;
   }
#line 1391 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 30: /* buffer: RW_RESIZE RW_BUFFER T_INT  */
#line 262 "src/parse.y"
   {
      pPfm->ResizeBuffer((yyvsp[0].ival));
      (yyval.n) = NULL;
   }
#line 1400 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 31: /* statistics: RW_PRINT RW_IO  */
#line 270 "src/parse.y"
   {
      #ifdef PF_STATS
         cout << "Statistics\n";
         cout << "----------\n";
         pStatisticsMgr->Print();
      #else
         cout << "Statitisics not compiled.\n";
      #endif
      (yyval.n) = NULL;
   }
#line 1415 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 32: /* statistics: RW_RESET RW_IO  */
#line 281 "src/parse.y"
   {
      #ifdef PF_STATS
         cout << "Statistics reset.\n";
         pStatisticsMgr->Reset();
      #else
         cout << "Statitisics not compiled.\n";
      #endif
      (yyval.n) = NULL;
   }
#line 1429 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 33: /* createtable: RW_CREATE RW_TABLE T_STRING '(' non_mt_attrtype_list ')'  */
#line 294 "src/parse.y"
   {
      (yyval.n) = create_table_node((yyvsp[-3].sval), (yyvsp[-1].n));
   }
#line 1437 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 34: /* createindex: RW_CREATE RW_INDEX T_STRING '(' T_STRING ')'  */
#line 301 "src/parse.y"
   {
      (yyval.n) = create_index_node((yyvsp[-3].sval), (yyvsp[-1].sval));
   }
#line 1445 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 35: /* droptable: RW_DROP RW_TABLE T_STRING  */
#line 308 "src/parse.y"
   {
      (yyval.n) = drop_table_node((yyvsp[0].sval));
   }
#line 1453 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 36: /* dropindex: RW_DROP RW_INDEX T_STRING '(' T_STRING ')'  */
#line 315 "src/parse.y"
   {
      (yyval.n) = drop_index_node((yyvsp[-3].sval), (yyvsp[-1].sval));
   }
#line 1461 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 37: /* load: RW_LOAD T_STRING '(' T_QSTRING ')'  */
#line 322 "src/parse.y"
   {
      (yyval.n) = load_node((yyvsp[-3].sval), (yyvsp[-1].sval));
   }
#line 1469 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 38: /* set: RW_SET T_STRING T_EQ T_QSTRING  */
#line 330 "src/parse.y"
   {
      (yyval.n) = set_node((yyvsp[-2].sval), (yyvsp[0].sval));
   }
#line 1477 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 39: /* help: RW_HELP opt_relname  */
#line 337 "src/parse.y"
   {
      (yyval.n) = help_node((yyvsp[0].sval));
   }
#line 1485 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 40: /* print: RW_PRINT T_STRING  */
#line 344 "src/parse.y"
   {
      (yyval.n) = print_node((yyvsp[0].sval));
   }
#line 1493 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 41: /* exit: RW_EXIT  */
#line 351 "src/parse.y"
   {
      (yyval.n) = NULL;
      bExit = 1;
   }
#line 1502 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 42: /* query: RW_SELECT non_mt_select_clause RW_FROM non_mt_relation_list opt_where_clause  */
#line 359 "src/parse.y"
   {
      (yyval.n) = query_node((yyvsp[-3].n), (yyvsp[-1].n), (yyvsp[0].n));
   }
#line 1510 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 43: /* insert: RW_INSERT RW_INTO T_STRING RW_VALUES '(' non_mt_value_list ')'  */
#line 366 "src/parse.y"
   {
      (yyval.n) = insert_node((yyvsp[-4].sval), (yyvsp[-1].n));
   }
#line 1518 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 44: /* delete: RW_DELETE RW_FROM T_STRING opt_where_clause  */
#line 373 "src/parse.y"
   {
      (yyval.n) = delete_node((yyvsp[-1].sval), (yyvsp[0].n));
   }
#line 1526 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 45: /* update: RW_UPDATE T_STRING RW_SET relattr T_EQ relattr_or_value opt_where_clause  */
#line 380 "src/parse.y"
   {
      (yyval.n) = update_node((yyvsp[-5].sval), (yyvsp[-3].n), (yyvsp[-1].n), (yyvsp[0].n));
   }
#line 1534 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 46: /* non_mt_attrtype_list: attrtype ',' non_mt_attrtype_list  */
#line 387 "src/parse.y"
   {
      (yyval.n) = prepend((yyvsp[-2].n), (yyvsp[0].n));
   }
#line 1542 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 47: /* non_mt_attrtype_list: attrtype  */
#line 391 "src/parse.y"
   {
      (yyval.n) = list_node((yyvsp[0].n));
   }
#line 1550 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 48: /* attrtype: T_STRING T_STRING  */
#line 398 "src/parse.y"
    {
      (yyval.n) = attrtype_node((yyvsp[-1].sval), (yyvsp[0].sval));
   }
#line 1558 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 50: /* non_mt_select_clause: '*'  */
#line 406 "src/parse.y"
   {
       (yyval.n) = list_node(relattr_node(NULL, (char*)"*"));
   }
#line 1566 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 51: /* non_mt_relattr_list: relattr ',' non_mt_relattr_list  */
#line 413 "src/parse.y"
   {
      (yyval.n) = prepend((yyvsp[-2].n), (yyvsp[0].n));
   }
#line 1574 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 52: /* non_mt_relattr_list: relattr  */
#line 417 "src/parse.y"
   {
      (yyval.n) = list_node((yyvsp[0].n));
   }
#line 1582 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 53: /* relattr: T_STRING '.' T_STRING  */
#line 424 "src/parse.y"
   {
      (yyval.n) = relattr_node((yyvsp[-2].sval), (yyvsp[0].sval));
   }
#line 1590 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 54: /* relattr: T_STRING  */
#line 428 "src/parse.y"
   {
      (yyval.n) = relattr_node(NULL, (yyvsp[0].sval));
   }
#line 1598 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 55: /* non_mt_relation_list: relation ',' non_mt_relation_list  */
#line 435 "src/parse.y"
   {
      (yyval.n) = prepend((yyvsp[-2].n), (yyvsp[0].n));
   }
#line 1606 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 56: /* non_mt_relation_list: relation  */
#line 439 "src/parse.y"
   {
      (yyval.n) = list_node((yyvsp[0].n));
   }
#line 1614 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 57: /* relation: T_STRING  */
#line 446 "src/parse.y"
   {
      (yyval.n) = relation_node((yyvsp[0].sval));
   }
#line 1622 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 58: /* opt_where_clause: RW_WHERE non_mt_cond_list  */
#line 453 "src/parse.y"
   {
      (yyval.n) = (yyvsp[0].n);
   }
#line 1630 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 59: /* opt_where_clause: nothing  */
#line 457 "src/parse.y"
   {
      (yyval.n) = NULL;
   }
#line 1638 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 60: /* non_mt_cond_list: condition RW_AND non_mt_cond_list  */
#line 464 "src/parse.y"
   {
      (yyval.n) = prepend((yyvsp[-2].n), (yyvsp[0].n));
   }
#line 1646 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 61: /* non_mt_cond_list: condition  */
#line 468 "src/parse.y"
   {
      (yyval.n) = list_node((yyvsp[0].n));
   }
#line 1654 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 62: /* condition: relattr op relattr_or_value  */
#line 475 "src/parse.y"
   {
      (yyval.n) = condition_node((yyvsp[-2].n), (yyvsp[-1].cval), (yyvsp[0].n));
   }
#line 1662 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 63: /* relattr_or_value: relattr  */
#line 482 "src/parse.y"
   {
      (yyval.n) = relattr_or_value_node((yyvsp[0].n), NULL);
   }
#line 1670 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 64: /* relattr_or_value: value  */
#line 486 "src/parse.y"
   {
      (yyval.n) = relattr_or_value_node(NULL, (yyvsp[0].n));
   }
#line 1678 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 65: /* non_mt_value_list: value ',' non_mt_value_list  */
#line 493 "src/parse.y"
   {
      (yyval.n) = prepend((yyvsp[-2].n), (yyvsp[0].n));
   }
#line 1686 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 66: /* non_mt_value_list: value  */
#line 497 "src/parse.y"
   {
      (yyval.n) = list_node((yyvsp[0].n));
   }
#line 1694 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 67: /* value: T_QSTRING  */
#line 504 "src/parse.y"
   {
      (yyval.n) = value_node(STRING, (void *) (yyvsp[0].sval));
   }
#line 1702 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 68: /* value: T_INT  */
#line 508 "src/parse.y"
   {
      (yyval.n) = value_node(INT, (void *)& (yyvsp[0].ival));
   }
#line 1710 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 69: /* value: T_REAL  */
#line 512 "src/parse.y"
   {
      (yyval.n) = value_node(FLOAT, (void *)& (yyvsp[0].rval));
   }
#line 1718 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 70: /* value: T_MBR  */
#line 516 "src/parse.y"
   {
      (yyval.n) = value_node(MBR, (void *)& (yyvsp[0].mval));
   }
#line 1726 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 71: /* opt_relname: T_STRING  */
#line 523 "src/parse.y"
   {
      (yyval.sval) = (yyvsp[0].sval);
   }
#line 1734 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 72: /* opt_relname: nothing  */
#line 527 "src/parse.y"
   {
      (yyval.sval) = NULL;
   }
#line 1742 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 73: /* op: T_LT  */
#line 534 "src/parse.y"
   {
      (yyval.cval) = LT_OP;
   }
#line 1750 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 74: /* op: T_LE  */
#line 538 "src/parse.y"
   {
      (yyval.cval) = LE_OP;
   }
#line 1758 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 75: /* op: T_GT  */
#line 542 "src/parse.y"
   {
      (yyval.cval) = GT_OP;
   }
#line 1766 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 76: /* op: T_GE  */
#line 546 "src/parse.y"
   {
      (yyval.cval) = GE_OP;
   }
#line 1774 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 77: /* op: T_EQ  */
#line 550 "src/parse.y"
   {
      (yyval.cval) = EQ_OP;
   }
#line 1782 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;

  case 78: /* op: T_NE  */
#line 554 "src/parse.y"
   {
      (yyval.cval) = NE_OP;
   }
#line 1790 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"
    break;


#line 1794 "/workspace/llm4binary/github/license_all_cmakelists_25/lyang1024[P]redbase/build_O3/parse.cpp"

      default: break;
    }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == YYEMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      yyerror (YY_("syntax error"));
    }

  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= YYEOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == YYEOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval);
          yychar = YYEMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;
  ++yynerrs;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;


      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END


  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturnlab;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturnlab;


/*-----------------------------------------------------------.
| yyexhaustedlab -- YYNOMEM (memory exhaustion) comes here.  |
`-----------------------------------------------------------*/
yyexhaustedlab:
  yyerror (YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturnlab;


/*----------------------------------------------------------.
| yyreturnlab -- parsing is finished, clean up and return.  |
`----------------------------------------------------------*/
yyreturnlab:
  if (yychar != YYEMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif

  return yyresult;
}